

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O1

double3 * tinyusdz::geometric_normal
                    (double3 *__return_storage_ptr__,double3 *p0,double3 *p1,double3 *p2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar1 = p1->_M_elems[0] - p0->_M_elems[0];
  dVar2 = p1->_M_elems[1] - p0->_M_elems[1];
  dVar6 = p1->_M_elems[2] - p0->_M_elems[2];
  dVar5 = p2->_M_elems[0] - p0->_M_elems[0];
  dVar7 = p2->_M_elems[1] - p0->_M_elems[1];
  dVar3 = p2->_M_elems[2] - p0->_M_elems[2];
  dVar4 = dVar2 * dVar3 - dVar7 * dVar6;
  dVar3 = dVar6 * dVar5 - dVar3 * dVar1;
  dVar5 = dVar7 * dVar1 - dVar5 * dVar2;
  dVar2 = dVar5 * dVar5 + dVar4 * dVar4 + dVar3 * dVar3;
  dVar1 = 0.0;
  if (2.220446049250313e-16 < dVar2) {
    if (dVar2 < 0.0) {
      dVar1 = sqrt(dVar2);
    }
    else {
      dVar1 = SQRT(dVar2);
    }
  }
  if (dVar1 <= 2.220446049250313e-16) {
    dVar1 = 2.220446049250313e-16;
  }
  __return_storage_ptr__->_M_elems[0] = dVar4 / dVar1;
  __return_storage_ptr__->_M_elems[1] = dVar3 / dVar1;
  __return_storage_ptr__->_M_elems[2] = dVar5 / dVar1;
  return __return_storage_ptr__;
}

Assistant:

value::double3 geometric_normal(const value::double3 &p0, const value::double3 &p1, const value::double3 &p2)
{
  value::double3 n = vcross(p1 - p0, p2 - p0);

  return vnormalize(n);
}